

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O0

uint crnlib::dxt1_block::get_block_colors4(color_quad_u8 *pDst,uint16 color0,uint16 color1)

{
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1c;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_18;
  color_quad_u8 c1;
  color_quad_u8 c0;
  uint16 color1_local;
  uint16 color0_local;
  color_quad_u8 *pDst_local;
  
  c1.field_0.m_u32._0_2_ = color1;
  c1.field_0.m_u32._2_2_ = color0;
  unpack_color((dxt1_block *)&local_18.field_0,color0,true,0xff);
  unpack_color((dxt1_block *)&local_1c.field_0,c1.field_0.m_u32._0_2_,true,0xff);
  color_quad<unsigned_char,_int>::operator=
            (pDst,(color_quad<unsigned_char,_int> *)&local_18.field_0);
  color_quad<unsigned_char,_int>::operator=
            (pDst + 1,(color_quad<unsigned_char,_int> *)&local_1c.field_0);
  color_quad<unsigned_char,_int>::set_noclamp_rgba
            (pDst + 2,((uint)local_18.field_0.r * 2 + (uint)local_1c.field_0.r) / 3,
             ((uint)local_18.field_0.g * 2 + (uint)local_1c.field_0.g) / 3,
             ((uint)local_18.field_0.b * 2 + (uint)local_1c.field_0.b) / 3,0xff);
  color_quad<unsigned_char,_int>::set_noclamp_rgba
            (pDst + 3,((uint)local_1c.field_0.r * 2 + (uint)local_18.field_0.r) / 3,
             ((uint)local_1c.field_0.g * 2 + (uint)local_18.field_0.g) / 3,
             ((uint)local_1c.field_0.b * 2 + (uint)local_18.field_0.b) / 3,0xff);
  return 4;
}

Assistant:

uint dxt1_block::get_block_colors4(color_quad_u8* pDst, uint16 color0, uint16 color1)
    {
        color_quad_u8 c0(unpack_color(color0, true));
        color_quad_u8 c1(unpack_color(color1, true));

        pDst[0] = c0;
        pDst[1] = c1;

        // The compiler changes the div3 into a mul by recip+shift.
        pDst[2].set_noclamp_rgba((c0.r * 2 + c1.r) / 3, (c0.g * 2 + c1.g) / 3, (c0.b * 2 + c1.b) / 3, 255U);
        pDst[3].set_noclamp_rgba((c1.r * 2 + c0.r) / 3, (c1.g * 2 + c0.g) / 3, (c1.b * 2 + c0.b) / 3, 255U);

        return 4;
    }